

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

plutovg_paint_t * plutovg_paint_create_rgba(float r,float g,float b,float a)

{
  plutovg_paint_t *ppVar1;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  plutovg_solid_paint_t *solid;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  
  ppVar1 = (plutovg_paint_t *)plutovg_paint_create(PLUTOVG_PAINT_TYPE_COLOR,0x18);
  if (0.0 <= r) {
    local_28 = r;
    if (1.0 < r) {
      local_28 = 1.0;
    }
    local_24 = local_28;
  }
  else {
    local_24 = 0.0;
  }
  ppVar1[1].ref_count = (int)local_24;
  if (0.0 <= g) {
    local_30 = g;
    if (1.0 < g) {
      local_30 = 1.0;
    }
    local_2c = local_30;
  }
  else {
    local_2c = 0.0;
  }
  ppVar1[1].type = (plutovg_paint_type_t)local_2c;
  if (0.0 <= b) {
    local_38 = b;
    if (1.0 < b) {
      local_38 = 1.0;
    }
    local_34 = local_38;
  }
  else {
    local_34 = 0.0;
  }
  ppVar1[2].ref_count = (int)local_34;
  if (0.0 <= a) {
    local_40 = a;
    if (1.0 < a) {
      local_40 = 1.0;
    }
    local_3c = local_40;
  }
  else {
    local_3c = 0.0;
  }
  ppVar1[2].type = (plutovg_paint_type_t)local_3c;
  return ppVar1;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_rgba(float r, float g, float b, float a)
{
    plutovg_solid_paint_t* solid = plutovg_paint_create(PLUTOVG_PAINT_TYPE_COLOR, sizeof(plutovg_solid_paint_t));
    solid->color.r = plutovg_clamp(r, 0.f, 1.f);
    solid->color.g = plutovg_clamp(g, 0.f, 1.f);
    solid->color.b = plutovg_clamp(b, 0.f, 1.f);
    solid->color.a = plutovg_clamp(a, 0.f, 1.f);
    return &solid->base;
}